

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<el::base::LogFormat>
          (TypedConfigurations *this,Level level,LogFormat *value,
          unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
          *confMap,bool includeGlobalLevel)

{
  bool bVar1;
  LogFormat *in_RCX;
  LogFormat *in_RDX;
  byte in_R8B;
  __enable_if_t<is_constructible<value_type,_pair<Level,_LogFormat>_&&>::value,_pair<iterator,_bool>_>
  _Var2;
  iterator it;
  unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  *in_stack_fffffffffffffda8;
  LogFormat *in_stack_fffffffffffffdb0;
  pair<el::Level,_el::base::LogFormat> *in_stack_fffffffffffffdb8;
  pair<el::Level,_el::base::LogFormat> *__x;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  bool local_229;
  pair<el::Level,_el::base::LogFormat> local_1f8;
  _Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true> local_138;
  _Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true> local_130;
  _Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true> local_128;
  undefined4 local_11c;
  _Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true> local_118;
  _Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true> local_110;
  undefined1 local_108;
  undefined4 local_ec;
  byte local_21;
  LogFormat *local_20;
  LogFormat *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = utils::std::
          unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
          ::empty((unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
                   *)0x23a1df);
  if ((bVar1) && ((local_21 & 1) != 0)) {
    local_ec = 1;
    std::make_pair<el::Level,el::base::LogFormat_const&>
              (&in_stack_fffffffffffffdb8->first,in_stack_fffffffffffffdb0);
    _Var2 = std::
            unordered_map<el::Level,el::base::LogFormat,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,el::base::LogFormat>>>
            ::insert<std::pair<el::Level,el::base::LogFormat>>
                      ((unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       in_stack_fffffffffffffdb8);
    local_110._M_cur =
         (__node_type *)
         _Var2.first.
         super__Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true>._M_cur;
    local_108 = _Var2.second;
    utils::std::pair<el::Level,_el::base::LogFormat>::~pair
              ((pair<el::Level,_el::base::LogFormat> *)0x23a26f);
  }
  else {
    local_11c = 1;
    local_118._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
         ::find(in_stack_fffffffffffffda8,(key_type *)0x23a2ba);
    local_128._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
         ::end(in_stack_fffffffffffffda8);
    bVar1 = utils::std::__detail::operator!=(&local_118,&local_128);
    local_229 = false;
    if (bVar1) {
      utils::std::__detail::
      _Node_iterator<std::pair<const_el::Level,_el::base::LogFormat>,_false,_true>::operator->
                ((_Node_iterator<std::pair<const_el::Level,_el::base::LogFormat>,_false,_true> *)
                 0x23a308);
      local_229 = LogFormat::operator==
                            ((LogFormat *)
                             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                             (LogFormat *)in_stack_fffffffffffffdb8);
    }
    if (local_229 == false) {
      local_130._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
           ::find(in_stack_fffffffffffffda8,(key_type *)0x23a344);
      local_118._M_cur = local_130._M_cur;
      local_138._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
           ::end(in_stack_fffffffffffffda8);
      bVar1 = utils::std::__detail::operator==(&local_118,&local_138);
      if (bVar1) {
        __x = &local_1f8;
        std::make_pair<el::Level&,el::base::LogFormat_const&>(&__x->first,local_20);
        std::
        unordered_map<el::Level,el::base::LogFormat,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,el::base::LogFormat>>>
        ::insert<std::pair<el::Level,el::base::LogFormat>>
                  ((unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),__x);
        utils::std::pair<el::Level,_el::base::LogFormat>::~pair
                  ((pair<el::Level,_el::base::LogFormat> *)0x23a3f1);
      }
      else {
        utils::std::
        unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
        ::at((unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
              *)in_stack_fffffffffffffdb0,(key_type *)local_18);
        LogFormat::operator=(in_stack_fffffffffffffdb0,local_18);
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::unordered_map<Level, Conf_T>* confMap,
                bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }